

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cxx
# Opt level: O0

int __thiscall
Fl_Value_Output_Type::textstuff(Fl_Value_Output_Type *this,int w,Fl_Font *f,int *s,Fl_Color *c)

{
  Fl_Font FVar1;
  Fl_Fontsize FVar2;
  Fl_Color FVar3;
  Fl_Value_Output *local_48;
  Fl_Value_Output *myo;
  Fl_Color *c_local;
  int *s_local;
  Fl_Font *f_local;
  int w_local;
  Fl_Value_Output_Type *this_local;
  
  if (w == 4) {
    local_48 = (Fl_Value_Output *)(this->super_Fl_Widget_Type).super_Fl_Type.factory[1].prev;
  }
  else {
    local_48 = (Fl_Value_Output *)(this->super_Fl_Widget_Type).o;
  }
  switch(w) {
  case 0:
  case 4:
    FVar1 = Fl_Value_Output::textfont(local_48);
    *f = FVar1;
    FVar2 = Fl_Value_Output::textsize(local_48);
    *s = FVar2;
    FVar3 = Fl_Value_Output::textcolor(local_48);
    *c = FVar3;
    break;
  case 1:
    Fl_Value_Output::textfont(local_48,*f);
    break;
  case 2:
    Fl_Value_Output::textsize(local_48,*s);
    break;
  case 3:
    Fl_Value_Output::textcolor(local_48,*c);
  }
  return 1;
}

Assistant:

int Fl_Value_Output_Type::textstuff(int w, Fl_Font& f, int& s, Fl_Color& c) {
  Fl_Value_Output *myo = (Fl_Value_Output*)(w==4 ? ((Fl_Widget_Type*)factory)->o : o);
  switch (w) {
    case 4:
    case 0: f = myo->textfont(); s = myo->textsize(); c = myo->textcolor(); break;
    case 1: myo->textfont(f); break;
    case 2: myo->textsize(s); break;
    case 3: myo->textcolor(c); break;
  }
  return 1;
}